

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O1

int mapVoronoi(Layer *l,int *out,int x,int z,int w,int h)

{
  Layer *pLVar1;
  int iVar2;
  int ph;
  int pw;
  int pz;
  int px;
  
  px = x + -2 >> 2;
  pz = z + -2 >> 2;
  pw = ((x + w + -2 >> 2) - px) + 2;
  ph = ((z + h + -2 >> 2) - pz) + 2;
  pLVar1 = l->p;
  if ((pLVar1 != (Layer *)0x0) && (iVar2 = (*pLVar1->getMap)(pLVar1,out,px,pz,pw,ph), iVar2 != 0)) {
    return iVar2;
  }
  memmove(out + (long)h * (long)w,out,(long)ph * (long)pw * 4);
  mapVoronoiPlane(l->startSalt,out,out + (long)h * (long)w,x + -2,z + -2,w,h,0,px,pz,pw,ph);
  return 0;
}

Assistant:

int mapVoronoi(const Layer * l, int * out, int x, int z, int w, int h)
{
    x -= 2;
    z -= 2;
    int px = x >> 2;
    int pz = z >> 2;
    int pw = ((x + w) >> 2) - px + 2;
    int ph = ((z + h) >> 2) - pz + 2;

    if (l->p)
    {
        int err = l->p->getMap(l->p, out, px, pz, pw, ph);
        if (err != 0)
            return err;
    }

    int *src = out + (int64_t)w*h;
    memmove(src, out, sizeof(int)*pw*ph);
    mapVoronoiPlane(l->startSalt, out, src, x,z,w,h, 0, px,pz,pw,ph);

    return 0;
}